

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O2

ecs_entity_t *
new_w_data(ecs_world_t *world,ecs_table_t *table,ecs_entities_t *component_ids,int32_t count,
          void **component_data,int32_t *row_out)

{
  ecs_vector_t *vector;
  ecs_entity_t entity;
  ecs_column_t *peVar1;
  ecs_copy_t p_Var2;
  int new_count;
  int32_t iVar3;
  uint uVar4;
  int32_t row;
  uint64_t *puVar5;
  void *pvVar6;
  ecs_data_t *data;
  void *pvVar7;
  void *pvVar8;
  ecs_c_info_t *peVar9;
  ecs_entity_t *peVar10;
  size_t sVar11;
  undefined4 in_register_0000000c;
  long lVar12;
  short offset;
  int elem_size;
  ulong uVar13;
  ulong uVar14;
  ecs_entities_t eVar15;
  ecs_entities_t added;
  ecs_table_t *local_40;
  int local_38;
  
  lVar12 = CONCAT44(in_register_0000000c,count);
  new_count = (int)component_ids;
  _ecs_assert(world != (ecs_world_t *)0x0,0xc,(char *)0x0,"world != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x4e8);
  if (world == (ecs_world_t *)0x0) {
    __assert_fail("world != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x4e8,
                  "const ecs_entity_t *new_w_data(ecs_world_t *, ecs_table_t *, ecs_entities_t *, int32_t, void **, int32_t *)"
                 );
  }
  _ecs_assert(table != (ecs_table_t *)0x0,0xc,(char *)0x0,"table != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x4e9);
  if (table == (ecs_table_t *)0x0) {
    __assert_fail("table != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x4e9,
                  "const ecs_entity_t *new_w_data(ecs_world_t *, ecs_table_t *, ecs_entities_t *, int32_t, void **, int32_t *)"
                 );
  }
  _ecs_assert(new_count != 0,0xc,(char *)0x0,"count != 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x4ea);
  if (new_count == 0) {
    __assert_fail("count != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x4ea,
                  "const ecs_entity_t *new_w_data(ecs_world_t *, ecs_table_t *, ecs_entities_t *, int32_t, void **, int32_t *)"
                 );
  }
  iVar3 = ecs_sparse_count((world->store).entity_index);
  puVar5 = ecs_sparse_new_ids((world->store).entity_index,new_count);
  _ecs_assert(puVar5 != (uint64_t *)0x0,0xc,(char *)0x0,"ids != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x4ee);
  if (puVar5 == (uint64_t *)0x0) {
    __assert_fail("ids != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x4ee,
                  "const ecs_entity_t *new_w_data(ecs_world_t *, ecs_table_t *, ecs_entities_t *, int32_t, void **, int32_t *)"
                 );
  }
  vector = table->type;
  if (vector != (ecs_vector_t *)0x0) {
    pvVar6 = _ecs_vector_first(vector,8,0x10);
    uVar4 = ecs_vector_count(vector);
    data = ecs_table_get_or_create_data(table);
    row = ecs_table_appendn(world,table,data,new_count,puVar5);
    eVar15 = ecs_type_to_entities(vector);
    added.array = eVar15.array;
    added.count = eVar15.count;
    pvVar7 = _ecs_vector_first(data->record_ptrs,8,0x10);
    uVar13 = 0;
    uVar14 = 0;
    if (0 < new_count) {
      uVar14 = (ulong)component_ids & 0xffffffff;
    }
    for (; uVar14 != uVar13; uVar13 = uVar13 + 1) {
      local_38 = row + 1 + (int)uVar13;
      local_40 = table;
      pvVar8 = _ecs_sparse_set((world->store).entity_index,0x10,puVar5[uVar13],&local_40);
      *(void **)((long)pvVar7 + uVar13 * 8 + (long)row * 8) = pvVar8;
    }
    ecs_defer_none(world,&world->stage);
    ecs_run_add_actions(world,table,data,row,new_count,&added,true,lVar12 == 0);
    if (lVar12 != 0) {
      uVar14 = 0;
      uVar13 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar13 = uVar14;
      }
      for (; uVar13 != uVar14; uVar14 = uVar14 + 1) {
        entity = *(ecs_entity_t *)((long)pvVar6 + uVar14 * 8);
        uVar4 = ecs_type_index_of(vector,entity);
        _ecs_assert(-1 < (int)uVar4,0xc,(char *)0x0,"table_index >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x51a);
        if ((int)uVar4 < 0) {
          __assert_fail("table_index >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                        ,0x51a,
                        "const ecs_entity_t *new_w_data(ecs_world_t *, ecs_table_t *, ecs_entities_t *, int32_t, void **, int32_t *)"
                       );
        }
        if ((int)uVar4 < table->column_count) {
          peVar1 = data->columns;
          offset = peVar1[uVar4].alignment;
          if (offset < 0x11) {
            offset = 0x10;
          }
          elem_size = (int)peVar1[uVar4].size;
          pvVar8 = _ecs_vector_first(peVar1[uVar4].data,elem_size,offset);
          pvVar7 = *(void **)(lVar12 + uVar14 * 8);
          if (pvVar7 != (void *)0x0) {
            pvVar8 = (void *)((long)pvVar8 + (long)(row * elem_size));
            peVar9 = get_c_info(world,entity);
            if ((peVar9 == (ecs_c_info_t *)0x0) ||
               (p_Var2 = (peVar9->lifecycle).copy, p_Var2 == (ecs_copy_t)0x0)) {
              memcpy(pvVar8,pvVar7,(long)(elem_size * new_count));
            }
            else {
              peVar10 = (ecs_entity_t *)_ecs_vector_first(data->entities,8,0x10);
              sVar11 = ecs_to_size_t((long)elem_size);
              (*p_Var2)(world,entity,peVar10,peVar10,pvVar8,pvVar7,sVar11,new_count,
                        (peVar9->lifecycle).ctx);
            }
          }
        }
      }
      ecs_run_set_systems(world,&added,table,data,row,new_count,true);
    }
    ecs_run_monitors(world,table,table->monitors,row,new_count,(ecs_vector_t *)0x0);
    ecs_defer_flush(world,&world->stage);
    if (component_data != (void **)0x0) {
      *(int32_t *)component_data = row;
    }
    puVar5 = ecs_sparse_ids((world->store).entity_index);
    puVar5 = puVar5 + iVar3;
  }
  return puVar5;
}

Assistant:

static
const ecs_entity_t* new_w_data(
    ecs_world_t * world,
    ecs_table_t * table,
    ecs_entities_t * component_ids,
    int32_t count,
    void ** component_data,
    int32_t * row_out)
{
    ecs_assert(world != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(table != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(count != 0, ECS_INTERNAL_ERROR, NULL);
    
    int32_t sparse_count = ecs_eis_count(world);
    const ecs_entity_t *ids = ecs_sparse_new_ids(world->store.entity_index, count);
    ecs_assert(ids != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_type_t type = table->type;   

    if (!type) {
        return ids;        
    }

    ecs_entities_t component_array = { 0 };
    if (!component_ids) {
        component_ids = &component_array;
        component_array.array = ecs_vector_first(type, ecs_entity_t);
        component_array.count = ecs_vector_count(type);
    }

    ecs_data_t *data = ecs_table_get_or_create_data(table);
    int32_t row = ecs_table_appendn(world, table, data, count, ids);
    ecs_entities_t added = ecs_type_to_entities(type);
    
    /* Update entity index. */
    int i;
    ecs_record_t **record_ptrs = ecs_vector_first(data->record_ptrs, ecs_record_t*);
    for (i = 0; i < count; i ++) { 
        record_ptrs[row + i] = ecs_eis_set(world, ids[i], 
        &(ecs_record_t){
            .table = table,
            .row = row + i + 1
        });
    }

    ecs_defer_none(world, &world->stage);

    ecs_run_add_actions(world, table, data, row, count, &added, 
        true, component_data == NULL);

    if (component_data) {
        /* Set components that we're setting in the component mask so the init
         * actions won't call OnSet triggers for them. This ensures we won't
         * call OnSet triggers multiple times for the same component */
        int32_t c_i;
        for (c_i = 0; c_i < component_ids->count; c_i ++) {
            ecs_entity_t c = component_ids->array[c_i];
            
            /* Bulk copy column data into new table */
            int32_t table_index = ecs_type_index_of(type, c);
            ecs_assert(table_index >= 0, ECS_INTERNAL_ERROR, NULL);
            if (table_index >= table->column_count) {
                continue;
            }

            ecs_column_t *column = &data->columns[table_index];
            int16_t size = column->size;
            int16_t alignment = column->alignment;
            void *ptr = ecs_vector_first_t(column->data, size, alignment);
            ptr = ECS_OFFSET(ptr, size * row);

            /* Copy component data */
            void *src_ptr = component_data[c_i];
            if (!src_ptr) {
                continue;
            }

            ecs_c_info_t *cdata = get_c_info(world, c);
            ecs_copy_t copy;
            if (cdata && (copy = cdata->lifecycle.copy)) {
                ecs_entity_t *entities = ecs_vector_first(data->entities, ecs_entity_t);
                copy(world, c, entities, entities, ptr, src_ptr, 
                    ecs_to_size_t(size), count, cdata->lifecycle.ctx);
            } else {
                ecs_os_memcpy(ptr, src_ptr, size * count);
            }
        };

        ecs_run_set_systems(world, &added, table, data, row, count, true);        
    }

    ecs_run_monitors(world, table, table->monitors, row, count, NULL);

    ecs_defer_flush(world, &world->stage);

    if (row_out) {
        *row_out = row;
    }

    ids = ecs_sparse_ids(world->store.entity_index);

    return &ids[sparse_count];
}